

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O0

void __thiscall cppnet::BlockMemoryPool::ReleaseHalf(BlockMemoryPool *this)

{
  bool bVar1;
  reference ppvVar2;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_50;
  const_iterator local_48;
  void **local_40;
  void *local_38;
  void *mem;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_28;
  iterator iter;
  size_t hale;
  size_t size;
  BlockMemoryPool *this_local;
  
  hale = std::vector<void_*,_std::allocator<void_*>_>::size(&this->_free_mem_vec);
  iter._M_current = (void **)(hale >> 1);
  local_28._M_current =
       (void **)std::vector<void_*,_std::allocator<void_*>_>::begin(&this->_free_mem_vec);
  do {
    mem = (void *)std::vector<void_*,_std::allocator<void_*>_>::end(&this->_free_mem_vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> *)
                       &mem);
    if (!bVar1) {
      return;
    }
    ppvVar2 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&local_28);
    local_38 = *ppvVar2;
    __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
    __normal_iterator<void**>
              ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)&local_48,
               &local_28);
    local_40 = (void **)std::vector<void_*,_std::allocator<void_*>_>::erase
                                  (&this->_free_mem_vec,local_48);
    local_28._M_current = local_40;
    free(local_38);
    hale = hale - 1;
    local_50._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::end(&this->_free_mem_vec);
    bVar1 = __gnu_cxx::operator==(&local_28,&local_50);
  } while (!bVar1 && iter._M_current < hale);
  return;
}

Assistant:

void BlockMemoryPool::ReleaseHalf() {
#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    size_t size = _free_mem_vec.size();
    size_t hale = size / 2;
    for (auto iter = _free_mem_vec.begin(); iter != _free_mem_vec.end();) {
        void* mem = *iter;

        iter = _free_mem_vec.erase(iter);
        free(mem);
        
        size--;
        if (iter == _free_mem_vec.end() || size <= hale) {
            break;
        }
    }
}